

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::FixupOutPolyline(Clipper *this,OutRec *outrec)

{
  OutPt *pOVar1;
  bool bVar2;
  OutPt *tmpPP;
  OutPt *lastPP;
  OutPt *pp;
  OutRec *outrec_local;
  Clipper *this_local;
  
  tmpPP = outrec->Pts->Prev;
  pOVar1 = outrec->Pts;
  pp = (OutPt *)outrec;
  outrec_local = (OutRec *)this;
  while (lastPP = pOVar1, lastPP != tmpPP) {
    lastPP = lastPP->Next;
    bVar2 = operator==(&lastPP->Pt,&lastPP->Prev->Pt);
    pOVar1 = lastPP;
    if (bVar2) {
      if (lastPP == tmpPP) {
        tmpPP = lastPP->Prev;
      }
      pOVar1 = lastPP->Prev;
      pOVar1->Next = lastPP->Next;
      lastPP->Next->Prev = pOVar1;
      if (lastPP != (OutPt *)0x0) {
        operator_delete(lastPP,0x28);
      }
    }
  }
  if (lastPP == lastPP->Prev) {
    DisposeOutPts(&lastPP);
    pp->Next = (OutPt *)0x0;
  }
  return;
}

Assistant:

void Clipper::FixupOutPolyline(OutRec &outrec)
{
  OutPt *pp = outrec.Pts;
  OutPt *lastPP = pp->Prev;
  while (pp != lastPP)
  {
    pp = pp->Next;
    if (pp->Pt == pp->Prev->Pt)
    {
      if (pp == lastPP) lastPP = pp->Prev;
      OutPt *tmpPP = pp->Prev;
      tmpPP->Next = pp->Next;
      pp->Next->Prev = tmpPP;
      delete pp;
      pp = tmpPP;
    }
  }

  if (pp == pp->Prev)
  {
    DisposeOutPts(pp);
    outrec.Pts = 0;
    return;
  }
}